

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

void Bac_PtrDumpModuleVerilog(FILE *pFile,Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  long lVar2;
  
  if (0 < vNtk->nSize) {
    fprintf((FILE *)pFile,"module %s (\n    ",*vNtk->pArray);
    if (1 < vNtk->nSize) {
      Bac_PtrDumpSignalsVerilog(pFile,(Vec_Ptr_t *)vNtk->pArray[1],1);
      if (2 < vNtk->nSize) {
        Bac_PtrDumpSignalsVerilog(pFile,(Vec_Ptr_t *)vNtk->pArray[2],0);
        fwrite("\n  );\n",6,1,(FILE *)pFile);
        fwrite("  input",7,1,(FILE *)pFile);
        if (1 < vNtk->nSize) {
          Bac_PtrDumpSignalsVerilog(pFile,(Vec_Ptr_t *)vNtk->pArray[1],0);
          fwrite(";\n",2,1,(FILE *)pFile);
          fwrite("  output",8,1,(FILE *)pFile);
          if (2 < vNtk->nSize) {
            Bac_PtrDumpSignalsVerilog(pFile,(Vec_Ptr_t *)vNtk->pArray[2],0);
            fwrite(";\n",2,1,(FILE *)pFile);
            if (3 < vNtk->nSize) {
              if (*(int *)((long)vNtk->pArray[3] + 4) != 0) {
                __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                              ,0xfc,"void Bac_PtrDumpModuleVerilog(FILE *, Vec_Ptr_t *)");
              }
              if (vNtk->nSize != 4) {
                pvVar1 = vNtk->pArray[4];
                if (0 < *(int *)((long)pvVar1 + 4)) {
                  lVar2 = 0;
                  do {
                    Bac_PtrDumpBoxVerilog
                              (pFile,*(Vec_Ptr_t **)(*(long *)((long)pvVar1 + 8) + lVar2 * 8));
                    lVar2 = lVar2 + 1;
                  } while (lVar2 < *(int *)((long)pvVar1 + 4));
                }
                fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrDumpModuleVerilog( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, "module %s (\n    ", (char *)Vec_PtrEntry(vNtk, 0) );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 1 );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, "\n  );\n" );
    fprintf( pFile, "  input" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, ";\n" );
    fprintf( pFile, "  output" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, ";\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, "endmodule\n\n" );
}